

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_62210::AssertInt16Fails(char *s)

{
  bool bVar1;
  size_t sVar2;
  Message *pMVar3;
  char *pcVar4;
  AssertHelper local_78;
  Message local_70;
  Result local_68;
  Enum local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  Message local_40;
  Result local_38;
  Enum local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  uint16_t actual;
  char *end;
  char *s_local;
  
  end = s;
  sVar2 = strlen(s);
  local_34 = Error;
  local_38 = wabt::ParseInt16(end,s + sVar2,(uint16_t *)((long)&gtest_ar.message_.ptr_ + 6),
                              SignedAndUnsigned);
  testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
            ((EqHelper<false> *)local_30,"Result::Error",
             "ParseInt16(s, end, &actual, ParseIntType::SignedAndUnsigned)",&local_34,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pMVar3 = testing::Message::operator<<(&local_40,&end);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
               ,0x71,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(&local_40);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_64 = Error;
    local_68 = wabt::ParseInt16(end,s + sVar2,(uint16_t *)((long)&gtest_ar.message_.ptr_ + 6),
                                UnsignedOnly);
    testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
              ((EqHelper<false> *)local_60,"Result::Error",
               "ParseInt16(s, end, &actual, ParseIntType::UnsignedOnly)",&local_64,&local_68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pMVar3 = testing::Message::operator<<(&local_70,&end);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
                 ,0x74,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::Message::~Message(&local_70);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  }
  return;
}

Assistant:

void AssertInt16Fails(const char* s) {
  const char* const end = s + strlen(s);
  uint16_t actual;
  ASSERT_EQ(Result::Error,
            ParseInt16(s, end, &actual, ParseIntType::SignedAndUnsigned))
      << s;
  ASSERT_EQ(Result::Error,
            ParseInt16(s, end, &actual, ParseIntType::UnsignedOnly))
      << s;
}